

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

void absl::cord_internal::anon_unknown_0::DumpAll
               (CordRep *rep,bool include_contents,ostream *stream,size_t depth)

{
  char *pcVar1;
  byte bVar2;
  ostream *poVar3;
  Nonnull<char_*> pcVar4;
  AlphaNum *b;
  CordRepSubstring *substring;
  AlphaNum *in_R8;
  long lVar5;
  Hex hex;
  anon_class_16_2_6856332a maybe_dump_data;
  string label;
  string sharing;
  string sptr;
  anon_class_16_2_6856332a local_138;
  string local_128;
  undefined1 local_108 [32];
  string local_e8;
  long *local_c8;
  char *local_c0;
  long local_b8 [4];
  AlphaNum local_98;
  AlphaNum local_60;
  
  if (0xe < depth) {
    __assert_fail("depth <= CordRepBtree::kMaxDepth + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x40,
                  "void absl::cord_internal::(anonymous namespace)::DumpAll(const CordRep *, bool, std::ostream &, size_t)"
                 );
  }
  b = (AlphaNum *)(local_108 + 0x10);
  if ((rep->refcount).count_.super___atomic_base<int>._M_i == 2) {
    local_108._0_8_ = b;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Private","");
  }
  else {
    local_c8 = (long *)0x7;
    local_c0 = "Shared(";
    pcVar1 = local_60.digits_;
    pcVar4 = numbers_internal::FastIntToBuffer
                       ((long)((rep->refcount).count_.super___atomic_base<int>._M_i >> 1),pcVar1);
    local_60.piece_._M_len = (long)pcVar4 - (long)pcVar1;
    b = &local_98;
    local_98.piece_._M_len = 1;
    local_98.piece_._M_str = ")";
    local_60.piece_._M_str = pcVar1;
    StrCat_abi_cxx11_((string *)local_108,(absl *)&local_c8,&local_60,b,in_R8);
  }
  local_c8 = (long *)0x2;
  local_c0 = "0x";
  local_98.digits_[8] = '\0';
  local_98.digits_[9] = '\0';
  local_98.digits_[10] = '\0';
  local_98.digits_[0xb] = '\0';
  local_98.digits_[0xc] = '\0';
  local_98.digits_[0xd] = '\0';
  local_98.digits_[0xe] = '\0';
  local_98.digits_[0xf] = '\0';
  local_98.piece_._M_str = (char *)0x0;
  local_98.digits_[0] = '\0';
  local_98.digits_[1] = '\0';
  local_98.digits_[2] = '\0';
  local_98.digits_[3] = '\0';
  local_98.digits_[4] = '\0';
  local_98.digits_[5] = '\0';
  local_98.digits_[6] = '\0';
  local_98.digits_[7] = '\0';
  hex._8_8_ = b;
  hex.value = 0x3001;
  local_98.piece_._M_len = (size_t)local_98.digits_;
  AbslStringify<absl::strings_internal::StringifySink>((absl *)&local_98,(StringifySink *)rep,hex);
  local_60.piece_._M_len = (size_t)local_98.piece_._M_str;
  local_60.piece_._M_str = (char *)local_98.piece_._M_len;
  StrCat_abi_cxx11_(&local_e8,(absl *)&local_c8,&local_60,(AlphaNum *)local_98.piece_._M_str);
  if ((char *)local_98.piece_._M_len != local_98.digits_) {
    operator_delete((void *)local_98.piece_._M_len,local_98.digits_._0_8_ + 1);
  }
  local_138.stream = stream;
  local_138.include_contents = include_contents;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)depth * '\x02');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_c8,(long)local_c0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_108._0_8_,local_108._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  bVar2 = rep->tag;
  if (bVar2 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"Substring, len = ",0x11);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", start = ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    DumpAll::anon_class_16_2_6856332a::operator()(&local_138,rep);
    DumpAll(*(CordRep **)&rep[1].refcount,include_contents,stream,depth + 1);
  }
  else if (bVar2 == 3) {
    if (rep->storage[0] == 0) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Leaf","");
    }
    else {
      local_c8 = (long *)0x5;
      local_c0 = "Node(";
      pcVar1 = local_60.digits_;
      pcVar4 = numbers_internal::FastIntToBuffer((uint)rep->storage[0],pcVar1);
      local_60.piece_._M_len = (size_t)(pcVar4 + -(long)pcVar1);
      local_98.piece_._M_len = 1;
      local_98.piece_._M_str = ")";
      local_60.piece_._M_str = pcVar1;
      StrCat_abi_cxx11_(&local_128,(absl *)&local_c8,&local_60,&local_98,in_R8);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_128._M_dataplus._M_p,local_128._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", len = ",8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", begin = ",10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", end = ",8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    bVar2 = rep->storage[2];
    if (rep->storage[1] != bVar2) {
      lVar5 = (ulong)rep->storage[1] << 3;
      do {
        DumpAll(*(CordRep **)(rep[1].storage + lVar5 + -0xd),include_contents,stream,depth + 1);
        lVar5 = lVar5 + 8;
      } while ((ulong)bVar2 * 8 != lVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (bVar2 < 6) {
      if (bVar2 != 5) goto LAB_0013ac7d;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Extn, len = ",0xc);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Flat, len = ",0xc);
      stream = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(stream,", cap = ",8);
      if ((rep->tag - 0xf9 < 7) || (rep->tag < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
    }
    std::ostream::_M_insert<unsigned_long>((ulong)stream);
    DumpAll::anon_class_16_2_6856332a::operator()(&local_138,rep);
  }
LAB_0013ac7d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((AlphaNum *)local_108._0_8_ != (AlphaNum *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  return;
}

Assistant:

void DumpAll(const CordRep* rep,
             bool include_contents,
             std::ostream& stream,
             size_t depth = 0) {
  // Allow for full height trees + substring -> flat / external nodes.
  assert(depth <= CordRepBtree::kMaxDepth + 2);
  std::string sharing = const_cast<CordRep*>(rep)->refcount.IsOne()
                            ? std::string("Private")
                            : absl::StrCat("Shared(", rep->refcount.Get(), ")");
  std::string sptr = absl::StrCat("0x", absl::Hex(rep));

  // Dumps the data contents of `rep` if `include_contents` is true.
  // Always emits a new line character.
  auto maybe_dump_data = [&stream, include_contents](const CordRep* r) {
    if (include_contents) {
      // Allow for up to 60 wide display of content data, which with some
      // indentation and prefix / labels keeps us within roughly 80-100 wide.
      constexpr size_t kMaxDataLength = 60;
      stream << ", data = \""
             << EdgeData(r).substr(0, kMaxDataLength)
             << (r->length > kMaxDataLength ? "\"..." : "\"");
    }
    stream << '\n';
  };

  // For each level, we print the 'shared/private' state and the rep pointer,
  // indented by two spaces per recursive depth.
  stream << std::string(depth * 2, ' ') << sharing << " (" << sptr << ") ";

  if (rep->IsBtree()) {
    const CordRepBtree* node = rep->btree();
    std::string label =
        node->height() ? absl::StrCat("Node(", node->height(), ")") : "Leaf";
    stream << label << ", len = " << node->length
           << ", begin = " << node->begin() << ", end = " << node->end()
           << "\n";
    for (CordRep* edge : node->Edges()) {
      DumpAll(edge, include_contents, stream, depth + 1);
    }
  } else if (rep->tag == SUBSTRING) {
    const CordRepSubstring* substring = rep->substring();
    stream << "Substring, len = " << rep->length
           << ", start = " << substring->start;
    maybe_dump_data(rep);
    DumpAll(substring->child, include_contents, stream, depth + 1);
  } else if (rep->tag >= FLAT) {
    stream << "Flat, len = " << rep->length
           << ", cap = " << rep->flat()->Capacity();
    maybe_dump_data(rep);
  } else if (rep->tag == EXTERNAL) {
    stream << "Extn, len = " << rep->length;
    maybe_dump_data(rep);
  }
}